

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
chrono::ChTriangleMeshShape::ArchiveOUT(ChTriangleMeshShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChTriangleMeshShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_38._value = (ChVector<double> *)&this->trimesh;
  local_38._name = "trimesh";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChTriangleMeshConnected>
            (marchive,(ChNameValue<std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>_> *)
                      &local_38);
  local_38._value = (ChVector<double> *)&this->wireframe;
  local_38._name = "wireframe";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->backface_cull;
  local_38._name = "backface_cull";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->name;
  local_38._name = "name";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive,&local_38);
  local_38._value = &this->scale;
  local_38._name = "scale";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChTriangleMeshShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChTriangleMeshShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(trimesh);
    marchive << CHNVP(wireframe);
    marchive << CHNVP(backface_cull);
    marchive << CHNVP(name);
    marchive << CHNVP(scale);
}